

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

Type * __thiscall
soul::AST::TypeMetaFunction::resolveAsType(Type *__return_storage_ptr__,TypeMetaFunction *this)

{
  int iVar1;
  Type type;
  Type local_30;
  Primitive local_14;
  
  iVar1 = (*(this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(this);
  if (((char)iVar1 != '\0') && (this->operation - sourceType < 6)) {
    throwErrorIfUnresolved(this);
    getSourceType(&local_30,this);
    switch(this->operation) {
    case sourceType:
      __return_storage_ptr__->category = local_30.category;
      __return_storage_ptr__->arrayElementCategory = local_30.arrayElementCategory;
      __return_storage_ptr__->isRef = local_30.isRef;
      __return_storage_ptr__->isConstant = (bool)local_30.isConstant;
      __return_storage_ptr__->primitiveType = (PrimitiveType)local_30.primitiveType.type;
      __return_storage_ptr__->boundingSize = local_30.boundingSize;
      __return_storage_ptr__->arrayElementBoundingSize = local_30.arrayElementBoundingSize;
      (__return_storage_ptr__->structure).object = local_30.structure.object;
      local_30.structure.object = (Structure *)0x0;
      break;
    case makeConst:
      Type::createConst(__return_storage_ptr__,&local_30);
      break;
    case makeReference:
      if (local_30.isRef == true) {
        Type::Type(__return_storage_ptr__,&local_30);
      }
      else {
        Type::createReference(__return_storage_ptr__,&local_30);
      }
      break;
    case removeReference:
      Type::removeReferenceIfPresent(__return_storage_ptr__,&local_30);
      break;
    case elementType:
      Type::getElementType(__return_storage_ptr__,&local_30);
      break;
    case primitiveType:
      Type::getPrimitiveType((Type *)&stack0xffffffffffffffec);
      __return_storage_ptr__->category = local_14 != invalid;
      __return_storage_ptr__->arrayElementCategory = invalid;
      __return_storage_ptr__->isRef = false;
      __return_storage_ptr__->isConstant = false;
      (__return_storage_ptr__->primitiveType).type = local_14;
      __return_storage_ptr__->boundingSize = 0;
      __return_storage_ptr__->arrayElementBoundingSize = 0;
      (__return_storage_ptr__->structure).object = (Structure *)0x0;
      break;
    default:
      throwInternalCompilerError("resolveAsType",0x7b2);
    }
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_30.structure);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError
            ("isResolved() && operationReturnsAType (operation)","resolveAsType",0x7a6);
}

Assistant:

Type resolveAsType() const override
        {
            SOUL_ASSERT (isResolved() && operationReturnsAType (operation));
            throwErrorIfUnresolved();

            auto type = getSourceType();

            if (operation == Op::sourceType)       return type;
            if (operation == Op::makeConst)        return type.createConst();
            if (operation == Op::makeReference)    return type.isReference() ? type : type.createReference();
            if (operation == Op::removeReference)  return type.removeReferenceIfPresent();
            if (operation == Op::elementType)      return type.getElementType();
            if (operation == Op::primitiveType)    return type.getPrimitiveType();

            SOUL_ASSERT_FALSE; return {};
        }